

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O1

void drotg(double *sa,double *sb,double *c,double *s)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = *sb;
  dVar1 = *sa;
  dVar5 = ABS(dVar3) + ABS(dVar1);
  dVar4 = 0.0;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    uVar2 = -(ulong)(ABS(dVar3) < ABS(dVar1));
    dVar4 = (dVar1 / dVar5) * (dVar1 / dVar5) + (dVar3 / dVar5) * (dVar3 / dVar5);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar3 = r8_sign((double)(~uVar2 & (ulong)dVar3 | uVar2 & (ulong)dVar1));
    dVar3 = dVar3 * dVar5 * dVar4;
    *c = *sa / dVar3;
    dVar4 = *sb / dVar3;
  }
  else {
    *c = 1.0;
    dVar3 = 0.0;
  }
  *s = dVar4;
  dVar1 = *c;
  if (dVar1 != 0.0) {
    dVar4 = (double)(-(ulong)(dVar4 < ABS(dVar1)) & (ulong)dVar4 |
                    ~-(ulong)(dVar4 < ABS(dVar1)) & (ulong)(1.0 / dVar1));
  }
  *sa = dVar3;
  *sb = dVar4;
  return;
}

Assistant:

void drotg ( double *sa, double *sb, double *c, double *s )

//****************************************************************************80
//
//  Purpose:
//
//    DROTG constructs a Givens plane rotation.
//
//  Discussion:
//
//    Given values A and B, this routine computes
//
//    SIGMA = sign ( A ) if abs ( A ) >  abs ( B )
//          = sign ( B ) if abs ( A ) <= abs ( B );
//
//    R     = SIGMA * ( A * A + B * B );
//
//    C = A / R if R is not 0
//      = 1     if R is 0;
//
//    S = B / R if R is not 0,
//        0     if R is 0.
//
//    The computed numbers then satisfy the equation
//
//    (  C  S ) ( A ) = ( R )
//    ( -S  C ) ( B ) = ( 0 )
//
//    The routine also computes
//
//    Z = S     if abs ( A ) > abs ( B ),
//      = 1 / C if abs ( A ) <= abs ( B ) and C is not 0,
//      = 1     if C is 0.
//
//    The single value Z encodes C and S, and hence the rotation:
//
//    If Z = 1, set C = 0 and S = 1;
//    If abs ( Z ) < 1, set C = sqrt ( 1 - Z * Z ) and S = Z;
//    if abs ( Z ) > 1, set C = 1/ Z and S = sqrt ( 1 - C * C );
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 May 2006
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input/output, double *SA, *SB,  On input, SA and SB are the values
//    A and B.  On output, SA is overwritten with R, and SB is
//    overwritten with Z.
//
//    Output, double *C, *S, the cosine and sine of the Givens rotation.
//
{
  double r;
  double roe;
  double scale;
  double z;

  if ( fabs ( *sb ) < fabs ( *sa ) )
  {
    roe = *sa;
  }
  else
  {
    roe = *sb;
  }

  scale = fabs ( *sa ) + fabs ( *sb );

  if ( scale == 0.0 )
  {
    *c = 1.0;
    *s = 0.0;
    r = 0.0;
  }
  else
  {
    r = scale * sqrt ( ( *sa / scale ) * ( *sa / scale )
                     + ( *sb / scale ) * ( *sb / scale ) );
    r = r8_sign ( roe ) * r;
    *c = *sa / r;
    *s = *sb / r;
  }

  if ( 0.0 < fabs ( *c ) && fabs ( *c ) <= *s )
  {
    z = 1.0 / *c;
  }
  else
  {
    z = *s;
  }

  *sa = r;
  *sb = z;

  return;
}